

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sc_uint_base.cpp
# Opt level: O0

bool __thiscall
sc_dt::sc_uint_subref_r::concat_get_ctrl(sc_uint_subref_r *this,sc_digit *dst_p,int low_i)

{
  int iVar1;
  int iVar2;
  uint_type mask;
  int left_shift;
  int end_i;
  int dst_i;
  int low_i_local;
  sc_digit *dst_p_local;
  sc_uint_subref_r *this_local;
  
  dst_i = low_i / 0x1e;
  iVar1 = this->m_left;
  iVar2 = this->m_right;
  dst_p[dst_i] = dst_p[dst_i] & ((uint)(-1L << ((byte)(low_i % 0x1e) & 0x3f)) ^ 0xffffffff);
  while (dst_i = dst_i + 1, dst_i <= (low_i + (iVar1 - iVar2)) / 0x1e) {
    dst_p[dst_i] = 0;
  }
  return false;
}

Assistant:

bool sc_uint_subref_r::concat_get_ctrl( sc_digit* dst_p, int low_i ) const
{
    int       dst_i;	   // Word in dst_p now processing.
    int       end_i;	   // Highest order word in dst_p to process.
    int       left_shift;  // Left shift for val.
    uint_type mask;	   // Mask for bits to extract or keep.

    dst_i = low_i / BITS_PER_DIGIT;
    left_shift = low_i % BITS_PER_DIGIT;
    end_i = (low_i + (m_left-m_right)) / BITS_PER_DIGIT;

    mask = ~(~UINT_ZERO << left_shift);
    dst_p[dst_i] = (sc_digit)((dst_p[dst_i] & mask));

    dst_i++;
    for ( ; dst_i <= end_i; dst_i++ ) dst_p[dst_i] = 0;

    return false;
}